

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

bool anon_unknown.dwarf_50b73::SetVoiceOffset
               (Voice *oldvoice,VoicePos *vpos,ALsource *source,ALCcontext *context,
               ALCdevice *device)

{
  __int_type_conflict2 _Var1;
  uint uVar2;
  VoiceChange *tail;
  long lVar3;
  ulong uVar4;
  BufferlistItem *BufferList;
  __int_type_conflict2 _Var5;
  bool bVar6;
  element_type voice;
  
  _Var1 = (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i;
  _Var5 = 0;
  for (lVar3 = _Var1 * 8; lVar3 != 0; lVar3 = lVar3 + -8) {
    voice = (&((context->mVoices)._M_b._M_p)->field_1)[_Var5].mArray[0];
    if ((((voice->mPlayState)._M_i == Stopped) &&
        ((voice->mSourceID).super___atomic_base<unsigned_int>._M_i == 0)) &&
       (((voice->mPendingChange)._M_base._M_i & 1U) == 0)) goto LAB_001267e8;
    _Var5 = _Var5 + 1;
  }
  if (((context->mVoices)._M_b._M_p)->mSize == _Var1) {
    ALCcontext::allocVoices(context,1);
  }
  LOCK();
  (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i =
       (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  _Var5 = (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i;
  lVar3 = _Var5 << 3;
  uVar4 = 0;
  do {
    if (lVar3 == 0) {
      voice = (Voice *)0x0;
LAB_001267e8:
      (voice->mPlayState)._M_i = Pending;
      (voice->mPosition).super___atomic_base<unsigned_int>._M_i = vpos->pos;
      (voice->mPositionFrac).super___atomic_base<unsigned_int>._M_i = vpos->frac;
      (voice->mCurrentBuffer)._M_b._M_p = vpos->bufferitem;
      if (vpos->frac == 0 && vpos->pos == 0) {
        BufferList = source->queue;
        uVar2 = (uint)(vpos->bufferitem != BufferList) << 4;
      }
      else {
        BufferList = source->queue;
        uVar2 = 0x10;
      }
      voice->mFlags = uVar2;
      InitVoice(voice,source,BufferList,context,device);
      source->VoiceIdx = (ALuint)_Var5;
      (oldvoice->mPendingChange)._M_base._M_i = true;
      tail = GetVoiceChanger(context);
      tail->mOldVoice = oldvoice;
      tail->mVoice = voice;
      tail->mSourceID = source->id;
      tail->mState = 0x1025;
      SendVoiceChanges(context,tail);
      bVar6 = true;
      if (((oldvoice->mSourceID).super___atomic_base<unsigned_int>._M_i == 0) &&
         ((voice->mPlayState)._M_i == Pending)) {
        ALCdevice::waitForMix(device);
        if ((voice->mPlayState)._M_i == Pending) {
          (voice->mCurrentBuffer)._M_b._M_p = (__pointer_type)0x0;
          (voice->mLoopBuffer)._M_b._M_p = (__pointer_type)0x0;
          (voice->mSourceID).super___atomic_base<unsigned_int>._M_i = 0;
          (voice->mPlayState)._M_i = Stopped;
          bVar6 = false;
        }
      }
      return bVar6;
    }
    voice = (&((context->mVoices)._M_b._M_p)->field_1)[uVar4].mArray[0];
    if ((((voice->mPlayState)._M_i == Stopped) &&
        ((voice->mSourceID).super___atomic_base<unsigned_int>._M_i == 0)) &&
       (((voice->mPendingChange)._M_base._M_i & 1U) == 0)) {
      _Var5 = uVar4 & 0xffffffff;
      goto LAB_001267e8;
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + -8;
  } while( true );
}

Assistant:

bool SetVoiceOffset(Voice *oldvoice, const VoicePos &vpos, ALsource *source, ALCcontext *context,
    ALCdevice *device)
{
    /* First, get a free voice to start at the new offset. */
    auto voicelist = context->getVoicesSpan();
    Voice *newvoice{};
    ALuint vidx{0};
    for(Voice *voice : voicelist)
    {
        if(voice->mPlayState.load(std::memory_order_acquire) == Voice::Stopped
            && voice->mSourceID.load(std::memory_order_relaxed) == 0u
            && voice->mPendingChange.load(std::memory_order_relaxed) == false)
        {
            newvoice = voice;
            break;
        }
        ++vidx;
    }
    if UNLIKELY(!newvoice)
    {
        auto &allvoices = *context->mVoices.load(std::memory_order_relaxed);
        if(allvoices.size() == voicelist.size())
            context->allocVoices(1);
        context->mActiveVoiceCount.fetch_add(1, std::memory_order_release);
        voicelist = context->getVoicesSpan();

        vidx = 0;
        for(Voice *voice : voicelist)
        {
            if(voice->mPlayState.load(std::memory_order_acquire) == Voice::Stopped
                && voice->mSourceID.load(std::memory_order_relaxed) == 0u
                && voice->mPendingChange.load(std::memory_order_relaxed) == false)
            {
                newvoice = voice;
                break;
            }
            ++vidx;
        }
    }